

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O2

void __thiscall helics::MultiBroker::MultiBroker(MultiBroker *this)

{
  CoreBroker::CoreBroker(&this->super_CoreBroker,false);
  (this->super_CoreBroker).super_Broker._vptr_Broker = (_func_int **)&PTR__MultiBroker_004cc1f0;
  (this->super_CoreBroker).super_BrokerBase._vptr_BrokerBase =
       (_func_int **)&PTR__MultiBroker_004cc350;
  (this->disconnectionStage).super___atomic_base<int>._M_i = 0;
  (this->comms).
  super__Vector_base<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->comms).
  super__Vector_base<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->comms).
  super__Vector_base<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->masterComm)._M_t.
  super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>._M_t.
  super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>.
  super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl = (CommsInterface *)0x0;
  NetworkBrokerData::NetworkBrokerData(&this->netInfo,TCP);
  (this->configFile)._M_dataplus._M_p = (pointer)&(this->configFile).field_2;
  (this->configFile)._M_string_length = 0;
  (this->configFile).field_2._M_local_buf[0] = '\0';
  (this->brokerInitialized)._M_base._M_i = false;
  this->type = MULTI;
  (this->routingTable).
  super__Vector_base<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->routingTable).
  super__Vector_base<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->routingTable).
  super__Vector_base<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

MultiBroker::MultiBroker() noexcept {}